

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *ht;
  ValueType VVar1;
  pointer ppVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  type pcVar10;
  type pcVar11;
  size_type sVar12;
  size_type sVar13;
  pointer ppVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  key_type pcVar17;
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *pdVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int i;
  int iVar22;
  char *pcVar23;
  float fVar24;
  pair<unsigned_long,_unsigned_long> pVar25;
  Settings __tmp;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  TypeParam other_ht;
  hasher hasher;
  KeyInfo __tmp_1;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_258;
  ulong uStack_230;
  value_type local_228;
  undefined1 local_218 [8];
  ValueType local_210;
  pointer ppStack_208;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_200;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_1f8;
  float local_1f0;
  float fStack_1ec;
  ulong uStack_1e8;
  Hasher local_1e0;
  undefined4 uStack_1d4;
  type local_1d0;
  type pcStack_1c8;
  size_type local_1c0;
  size_type sStack_1b8;
  ulong local_1b0;
  pointer local_198;
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_190;
  undefined1 local_188 [8];
  pointer local_180;
  pointer ppStack_178;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_170;
  ulong uStack_168;
  float local_160;
  float fStack_15c;
  undefined8 uStack_158;
  Hasher local_150;
  undefined4 uStack_144;
  key_type local_140;
  type pcStack_138;
  size_type local_130;
  size_type sStack_128;
  ulong local_120;
  pointer local_108;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  local_f8;
  key_equal local_70;
  hasher local_64 [4];
  
  local_64[0].id_ = 1;
  local_64[0].num_hashes_ = 0;
  local_64[0].num_compares_ = 0;
  local_188 = (undefined1  [8])((ulong)local_188 & 0xffffffff00000000);
  local_180 = (pointer)0x0;
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)&local_f8,200,local_64,local_64,(allocator_type *)local_188);
  pcVar17 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)this,1);
  local_190 = &(this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep;
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(local_190);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  *(key_type *)
   ((long)&(this->
           super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.key_info + 0x10) = pcVar17;
  pdVar18 = (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)this,2);
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_f8.ht_.rep);
  local_f8.ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  use_deleted_ = true;
  iVar22 = 3;
  local_f8.ht_.rep.key_info.delkey = (type)pdVar18;
  do {
    UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)(value_type *)local_218);
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_188,
             &(this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)local_218);
    if (local_210.s_ != "hi") {
      free(local_210.s_);
    }
    iVar22 = iVar22 + 1;
  } while (iVar22 != 2000);
  local_188 = (undefined1  [8])
              HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                           *)this,1000);
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase(local_190,(key_type *)local_188);
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)local_218);
  ht = &local_f8.ht_;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_188,&local_f8,(value_type *)local_218);
  if (local_210.s_ != "hi") {
    free(local_210.s_);
  }
  local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_f8.ht_.rep.num_buckets;
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::swap(local_190,&ht->rep);
  local_218 = (undefined1  [8])
              HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                           *)this,2);
  local_258.first.super_iterator.ht =
       *(dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.key_info + 0x10);
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_188,"this->UniqueKey(2)","this->ht_.deleted_key()",(char **)local_218
             ,(char **)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1db,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_218 = (undefined1  [8])
              HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                           *)this,1);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_f8.ht_.rep.key_info.delkey;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_188,"this->UniqueKey(1)","other_ht.deleted_key()",(char **)local_218,
             (char **)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1dc,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_218._0_4_ = 1;
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,
                   (local_190->settings).
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"1","this->ht_.hash_funct().id()",(int *)local_218,
             (int *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1de,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,
                   local_f8.ht_.rep.settings.
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"0","other_ht.hash_funct().id()",(int *)local_218,
             (int *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1df,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_218._0_4_ = 1;
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"1","this->ht_.key_eq().id()",(int *)local_218,(int *)&local_258)
  ;
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e1,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,
                   local_f8.ht_.rep.key_info.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"0","other_ht.key_eq().id()",(int *)local_218,(int *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e2,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_218 = (undefined1  [8])
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_buckets;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_188,"expected_buckets","this->ht_.bucket_count()",
             (unsigned_long *)&local_100,(unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e4,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_218 = (undefined1  [8])local_f8.ht_.rep.num_buckets;
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,200);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)local_188,"other_ht.bucket_count()","200u",(unsigned_long *)local_218,
             (uint *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e5,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,1);
  local_218 = (undefined1  [8])
              ((this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","this->ht_.size()",(uint *)&local_258,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e7,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,0x7cc);
  local_218 = (undefined1  [8])(local_f8.ht_.rep.num_elements - local_f8.ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1996u","other_ht.size()",(uint *)&local_258,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e8,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_228.first = (char *)((ulong)local_228.first._4_4_ << 0x20);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this,0x6f);
  pVar25 = google::
           dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_190,(char **)&local_258);
  local_218._1_7_ = 0;
  local_218[0] = pVar25.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_228,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ea,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_228.first = (char *)CONCAT44(local_228.first._4_4_,1);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this,0x6f);
  pVar25 = google::
           dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)ht,(char **)&local_258);
  local_218._1_7_ = 0;
  local_218[0] = pVar25.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","other_ht.count(this->UniqueKey(111))",(uint *)&local_228,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1eb,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_228.first = (char *)CONCAT44(local_228.first._4_4_,1);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this,0x7d1);
  pVar25 = google::
           dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_190,(char **)&local_258);
  local_218._1_7_ = 0;
  local_218[0] = pVar25.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","this->ht_.count(this->UniqueKey(2001))",(uint *)&local_228,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ec,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_228.first = (char *)((ulong)local_228.first & 0xffffffff00000000);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this,0x7d1);
  pVar25 = google::
           dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)ht,(char **)&local_258);
  local_218._1_7_ = 0;
  local_218[0] = pVar25.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","other_ht.count(this->UniqueKey(2001))",(uint *)&local_228,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ed,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_228.first = (char *)((ulong)local_228.first & 0xffffffff00000000);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this,1000);
  pVar25 = google::
           dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_190,(char **)&local_258);
  local_218._1_7_ = 0;
  local_218[0] = pVar25.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","this->ht_.count(this->UniqueKey(1000))",(uint *)&local_228,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ee,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_228.first = (char *)((ulong)local_228.first & 0xffffffff00000000);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this,1000);
  pVar25 = google::
           dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)ht,(char **)&local_258);
  local_218._1_7_ = 0;
  local_218[0] = pVar25.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","other_ht.count(this->UniqueKey(1000))",(uint *)&local_228,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ef,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::swap(local_190,&ht->rep);
  local_218 = (undefined1  [8])
              HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                           *)this,1);
  local_258.first.super_iterator.ht =
       *(dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.key_info + 0x10);
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_188,"this->UniqueKey(1)","this->ht_.deleted_key()",(char **)local_218
             ,(char **)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fc,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_218 = (undefined1  [8])
              HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                           *)this,2);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_f8.ht_.rep.key_info.delkey;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_188,"this->UniqueKey(2)","other_ht.deleted_key()",(char **)local_218,
             (char **)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fd,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,
                   (local_190->settings).
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"0","this->ht_.hash_funct().id()",(int *)local_218,
             (int *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fe,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_218._0_4_ = 1;
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,
                   local_f8.ht_.rep.settings.
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"1","other_ht.hash_funct().id()",(int *)local_218,
             (int *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ff,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,0x7cc);
  local_218 = (undefined1  [8])
              ((this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1996u","this->ht_.size()",(uint *)&local_258,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x200,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.super_iterator.ht._4_4_,1);
  local_218 = (undefined1  [8])(local_f8.ht_.rep.num_elements - local_f8.ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","other_ht.size()",(uint *)&local_258,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x201,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_228.first = (char *)CONCAT44(local_228.first._4_4_,1);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this,0x6f);
  pVar25 = google::
           dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_190,(char **)&local_258);
  local_218._1_7_ = 0;
  local_218[0] = pVar25.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_228,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x202,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_228.first = (char *)((ulong)local_228.first & 0xffffffff00000000);
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this,0x6f);
  pVar25 = google::
           dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)ht,(char **)&local_258);
  local_218._1_7_ = 0;
  local_218[0] = pVar25.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","other_ht.count(this->UniqueKey(111))",(uint *)&local_228,
             (unsigned_long *)local_218);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_180 == (pointer)0x0) {
      pcVar23 = "";
    }
    else {
      pcVar23 = local_180->first;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x203,pcVar23);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  ppVar2 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)local_180->first != local_180 + 1) {
      operator_delete((pointer)local_180->first);
    }
    operator_delete(ppVar2);
  }
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_258.first.super_iterator.pos =
       (pointer)((ulong)local_258.first.super_iterator.pos._4_4_ << 0x20);
  local_228.first = (char *)0x0;
  local_228.second.s_._0_4_ = 0;
  local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
  local_210.s_ = (char *)0x0;
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_188,0,(hasher *)&local_258,(key_equal *)&local_228,(allocator_type *)local_218
            );
  pcVar17 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)this,1);
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_180);
  uStack_158._0_3_ = CONCAT12(true,(undefined2)uStack_158);
  iVar22 = 2;
  local_140 = pcVar17;
  do {
    UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)&local_258);
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_218,
             (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_188,(value_type *)&local_258);
    if (local_258.first.super_iterator.pos != (pointer)"hi") {
      free(local_258.first.super_iterator.pos);
    }
    iVar22 = iVar22 + 1;
  } while (iVar22 != 10000);
  local_228.first = (char *)0x0;
  local_228.second.s_._0_4_ = 0;
  local_70.id_ = 0;
  local_70.num_hashes_ = 0;
  local_70.num_compares_ = 0;
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_258.first.super_iterator.ht & 0xffffffff00000000);
  local_258.first.super_iterator.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_218,0,(hasher *)&local_228,&local_70,(allocator_type *)&local_258);
  uVar21 = local_120;
  uVar15 = _local_160;
  ppVar14 = local_198;
  uVar19 = local_1b0;
  sVar13 = sStack_1b8;
  sVar12 = local_1c0;
  pcVar11 = pcStack_1c8;
  pcVar10 = local_1d0;
  uVar8 = stack0xfffffffffffffe28;
  uVar6 = local_1e0._0_8_;
  uVar5 = uStack_1e8;
  uVar3 = _local_1f0;
  ppVar2 = ppStack_208;
  VVar1.s_ = local_210.s_;
  local_258._32_8_ = _local_1f0;
  uStack_230 = uStack_1e8;
  local_258.first.super_iterator.end = (pointer)local_200;
  local_258.first.parent_ = pBStack_1f8;
  local_258.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_210.s_;
  local_258.first.super_iterator.pos = ppStack_208;
  local_1f0 = local_160;
  fStack_1ec = fStack_15c;
  uVar4 = _local_1f0;
  local_210.s_ = (char *)local_180;
  ppStack_208 = ppStack_178;
  local_1f0 = (float)uVar3;
  fStack_1ec = SUB84(uVar3,4);
  local_160 = local_1f0;
  fStack_15c = fStack_1ec;
  uVar16 = _local_160;
  local_180 = (pointer)VVar1.s_;
  ppStack_178 = ppVar2;
  local_1d0 = local_140;
  pcStack_1c8 = pcStack_138;
  local_1e0.id_ = local_150.id_;
  local_1e0.num_hashes_ = local_150.num_hashes_;
  uVar7 = local_1e0._0_8_;
  local_1e0.num_compares_ = local_150.num_compares_;
  uStack_1d4 = uStack_144;
  uVar9 = stack0xfffffffffffffe28;
  local_140 = pcVar10;
  pcStack_138 = pcVar11;
  local_1e0.id_ = (int)uVar6;
  local_1e0.num_hashes_ = SUB84(uVar6,4);
  local_150.id_ = local_1e0.id_;
  local_150.num_hashes_ = local_1e0.num_hashes_;
  local_1e0.num_compares_ = (int)uVar8;
  uStack_1d4 = SUB84(uVar8,4);
  local_150.num_compares_ = local_1e0.num_compares_;
  uStack_144 = uStack_1d4;
  local_1c0 = local_130;
  sStack_1b8 = sStack_128;
  local_130 = sVar12;
  sStack_128 = sVar13;
  local_1b0 = local_120;
  local_120 = uVar19;
  local_198 = local_108;
  local_108 = ppVar14;
  local_1f0 = (float)uVar15;
  local_1f0 = local_1f0 * (float)uVar21;
  uVar20 = (ulong)local_1f0;
  local_200 = (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)((long)(local_1f0 - 9.223372e+18) & (long)uVar20 >> 0x3f | uVar20);
  fStack_1ec = SUB84(uVar15,4);
  fStack_1ec = (float)uVar21 * fStack_1ec;
  uVar21 = (ulong)fStack_1ec;
  pBStack_1f8 = (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)((long)(fStack_1ec - 9.223372e+18) & (long)uVar21 >> 0x3f | uVar21);
  uStack_1e8 = uStack_158 & 0xffffffffffffff00;
  fVar24 = (float)uVar19;
  local_160 = (float)uVar3;
  local_160 = local_160 * fVar24;
  uVar19 = (ulong)local_160;
  local_170 = (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)((long)(local_160 - 9.223372e+18) & (long)uVar19 >> 0x3f | uVar19);
  fStack_15c = SUB84(uVar3,4);
  fVar24 = fVar24 * fStack_15c;
  uStack_168 = (ulong)fVar24;
  uStack_168 = (long)(fVar24 - 9.223372e+18) & (long)uStack_168 >> 0x3f | uStack_168;
  uStack_158 = uVar5 & 0xffffffffffffff00;
  _local_1f0 = uVar4;
  local_1e0._0_8_ = uVar7;
  unique0x10002ac2 = uVar9;
  _local_160 = uVar16;
  pcVar17 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)this,1);
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_180);
  uStack_158._2_1_ = true;
  iVar22 = 2;
  local_140 = pcVar17;
  do {
    UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)&local_228);
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_258,
             (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_188,&local_228);
    if ((char *)CONCAT44(local_228.second.s_._4_4_,local_228.second.s_._0_4_) != "hi") {
      free((char *)CONCAT44(local_228.second.s_._4_4_,local_228.second.s_._0_4_));
    }
    iVar22 = iVar22 + 1;
  } while (iVar22 != 10000);
  local_218 = (undefined1  [8])&PTR__BaseHashtableInterface_00c26388;
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~dense_hashtable((dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)&local_210);
  local_188 = (undefined1  [8])&PTR__BaseHashtableInterface_00c26388;
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~dense_hashtable((dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)&local_180);
  local_f8._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c26388;
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~dense_hashtable(&local_f8.ht_.rep);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}